

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BindDecimalAvg
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  hugeint_t input;
  undefined1 uVar1;
  pointer pEVar2;
  reference pvVar3;
  long in_RDX;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  LogicalType decimal_type;
  AggregateFunction *in_stack_fffffffffffffe08;
  unique_ptr<duckdb::AverageDecimalBindData,_std::default_delete<duckdb::AverageDecimalBindData>_>
  *puVar4;
  AggregateFunction *in_stack_fffffffffffffe10;
  LogicalType *this;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> args;
  LogicalType local_190 [239];
  PhysicalType in_stack_ffffffffffffff5f;
  LogicalType local_38 [32];
  long local_18;
  
  args._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_18 = in_RDX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffe10);
  duckdb::LogicalType::LogicalType(local_38,(LogicalType *)(pEVar2 + 0x38));
  LogicalType::InternalType(local_38);
  GetAverageAggregate(in_stack_ffffffffffffff5f);
  AggregateFunction::operator=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  AggregateFunction::~AggregateFunction(in_stack_fffffffffffffe10);
  std::__cxx11::string::operator=((string *)(local_18 + 8),"avg");
  pvVar3 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffe10,
                      (size_type)in_stack_fffffffffffffe08);
  LogicalType::operator=
            ((LogicalType *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             (LogicalType *)in_stack_fffffffffffffe10);
  duckdb::LogicalType::LogicalType(local_190,DOUBLE);
  this = local_190;
  LogicalType::operator=(this,(LogicalType *)in_stack_fffffffffffffe08);
  duckdb::LogicalType::~LogicalType(this);
  uVar1 = duckdb::DecimalType::GetScale(local_38);
  input.lower._7_1_ = uVar1;
  input.lower._0_7_ = in_stack_fffffffffffffe18;
  input.upper = (int64_t)pvVar3;
  puVar4 = (unique_ptr<duckdb::AverageDecimalBindData,_std::default_delete<duckdb::AverageDecimalBindData>_>
            *)Hugeint::Cast<double>(input);
  make_uniq<duckdb::AverageDecimalBindData,double>((double *)args._M_head_impl);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::AverageDecimalBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this,puVar4);
  unique_ptr<duckdb::AverageDecimalBindData,_std::default_delete<duckdb::AverageDecimalBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::AverageDecimalBindData,_std::default_delete<duckdb::AverageDecimalBindData>,_true>
                 *)0x80baad);
  duckdb::LogicalType::~LogicalType(local_38);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> BindDecimalAvg(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	function = GetAverageAggregate(decimal_type.InternalType());
	function.name = "avg";
	function.arguments[0] = decimal_type;
	function.return_type = LogicalType::DOUBLE;
	return make_uniq<AverageDecimalBindData>(
	    Hugeint::Cast<double>(Hugeint::POWERS_OF_TEN[DecimalType::GetScale(decimal_type)]));
}